

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::moveAppend
          (QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *b,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *e)

{
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_RDI;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                        ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                         0x2f5d77);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      in_RDI->second = (QHttpNetworkReply *)&in_RDI->second->field_0x1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }